

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cpp
# Opt level: O2

void __thiscall chatter::Peer::reset(Peer *this)

{
  ProtocolChannel *pPVar1;
  HostAddress in_RAX;
  list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
  *this_00;
  long lVar2;
  HostAddress local_18;
  
  this->m_state = DISCONNECTED;
  local_18 = in_RAX;
  HostAddress::HostAddress(&local_18);
  (this->m_address).m_port = local_18.m_port;
  (this->m_address).m_address = local_18.m_address;
  this->m_is_incoming_connection = false;
  this->m_connect_ts = 0;
  this->m_last_recv_ts = 0;
  this->m_rtt_avg = 0;
  this->m_rtt_dev = 0;
  this->m_last_ping_ts = 0;
  this->m_last_rtt_ts = 0;
  this->m_congestion_window = 3000;
  this->m_bytes_on_wire = 0;
  pPVar1 = this->m_channels;
  for (lVar2 = 0; this_00 = &pPVar1->sent_reliable, lVar2 != 0x21; lVar2 = lVar2 + 1) {
    std::__cxx11::
    list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
    clear(this_00);
    *(undefined4 *)((long)(this_00 + -1) + 0x14) = 0;
    *(char *)((long)(this_00 + -1) + 0x10) = (char)lVar2;
    pPVar1 = (ProtocolChannel *)(this_00 + 1);
  }
  return;
}

Assistant:

void Peer::reset()
{
    m_state = PeerState::DISCONNECTED;
    m_address = HostAddress();
    m_is_incoming_connection = false;
    m_connect_ts = 0;
    m_last_recv_ts = 0;
    m_last_ping_ts = 0;
    m_last_rtt_ts = 0;
    m_rtt_avg = 0;
    m_rtt_dev = 0;
    m_congestion_window = kMinCongestionWindow;
    m_bytes_on_wire = 0;

    for (int i = 0; i < 33; ++i) {
        m_channels[i].sent_reliable.clear();
        m_channels[i].next_sequence = 0;
        m_channels[i].id = i;
    }
}